

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O1

size_t __thiscall proto3::StringtoInt::ByteSizeLong(StringtoInt *this)

{
  size_t sVar1;
  size_t sVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  sVar2 = (size_t)*(uint *)((long)&this->field_0 + 0x10);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  uVar4 = *(uint *)((long)&this->field_0 + 0x18);
  uVar5 = (ulong)uVar4;
  if (uVar4 == *(uint *)((long)&this->field_0 + 0x14)) {
    uVar5 = 0;
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_.
                                         super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                         .field_0 + 0x10) + uVar5 * 8);
    if (plVar3 == (long *)0x0) {
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  do {
    if (plVar3 == (long *)0x0) {
      sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                        (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
      return sVar2;
    }
    sVar1 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)5>
            ::ByteSizeLong((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar3 + 1),(int *)(plVar3 + 5));
    plVar3 = (long *)*plVar3;
    if (plVar3 == (long *)0x0) {
      do {
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        if (*(uint *)((long)&this->field_0 + 0x14) <= uVar4) {
          plVar3 = (long *)0x0;
          uVar5 = 0;
          break;
        }
        plVar3 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_.
                                             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                             .field_0 + 0x10) + (ulong)uVar4 * 8);
      } while (plVar3 == (long *)0x0);
    }
    sVar2 = sVar2 + sVar1;
  } while( true );
}

Assistant:

::size_t StringtoInt::ByteSizeLong() const {
  const StringtoInt& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3.StringtoInt)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<string, int32> map = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_size());
      for (const auto& entry : this_._internal_map()) {
        total_size += _pbi::MapEntryFuncs<std::string, ::int32_t,
                                       _pbi::WireFormatLite::TYPE_STRING,
                                       _pbi::WireFormatLite::TYPE_INT32>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}